

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_part(REF_EDGE ref_edge,REF_INT edge,REF_INT *part)

{
  int iVar1;
  REF_NODE pRVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  pRVar2 = ref_edge->node;
  iVar3 = ref_edge->e2n[edge * 2];
  lVar5 = -1;
  if ((-1 < (long)iVar3) && (iVar3 < pRVar2->max)) {
    lVar5 = -1;
    if (-1 < pRVar2->global[iVar3]) {
      lVar5 = pRVar2->global[iVar3];
    }
  }
  iVar1 = ref_edge->e2n[(int)(edge * 2 | 1)];
  lVar4 = -1;
  if ((-1 < (long)iVar1) && (iVar1 < pRVar2->max)) {
    lVar4 = -1;
    if (-1 < pRVar2->global[iVar1]) {
      lVar4 = pRVar2->global[iVar1];
    }
  }
  if (lVar4 <= lVar5) {
    iVar3 = iVar1;
  }
  *part = pRVar2->part[iVar3];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_edge_part(REF_EDGE ref_edge, REF_INT edge,
                                 REF_INT *part) {
  REF_NODE ref_node = ref_edge_node(ref_edge);

  if (ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge)) <
      ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge))) {
    *part = ref_node_part(ref_node, ref_edge_e2n(ref_edge, 0, edge));
  } else {
    *part = ref_node_part(ref_node, ref_edge_e2n(ref_edge, 1, edge));
  }

  return REF_SUCCESS;
}